

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O1

void __thiscall LinearExpert::e_step(LinearExpert *this,Z *z,X *x,Scal h)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  Index othersize_1;
  long lVar9;
  long lVar10;
  Index othersize;
  X xh;
  Z zh;
  false_type local_9a;
  add local_99;
  double local_98;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_78;
  X *local_60;
  Scal local_58;
  double local_48;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_40;
  Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  local_60 = x;
  local_58 = h;
  local_98 = pow(this->H + h,this->alpha);
  local_48 = pow(this->H,this->alpha);
  this->H = this->H + local_58;
  uVar7 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_78.m_storage.m_data = (double *)0x0;
  local_78.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_78,uVar7,1);
  pdVar3 = (z->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (local_78.m_storage.m_rows != uVar7) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_78,uVar7,1);
  }
  uVar7 = local_78.m_storage.m_rows - (local_78.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_78.m_storage.m_rows) {
    lVar9 = 0;
    do {
      pdVar4 = pdVar3 + lVar9;
      dVar2 = pdVar4[1];
      local_78.m_storage.m_data[lVar9] = *pdVar4 * local_58;
      (local_78.m_storage.m_data + lVar9)[1] = dVar2 * local_58;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar7);
  }
  if ((long)uVar7 < local_78.m_storage.m_rows) {
    do {
      local_78.m_storage.m_data[uVar7] = pdVar3[uVar7] * local_58;
      uVar7 = uVar7 + 1;
    } while (local_78.m_storage.m_rows != uVar7);
  }
  uVar7 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  local_88.m_storage.m_data = (double *)0x0;
  local_88.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,uVar7,1);
  pdVar3 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  if (local_88.m_storage.m_rows != uVar7) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,uVar7,1);
  }
  uVar7 = local_88.m_storage.m_rows - (local_88.m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_88.m_storage.m_rows) {
    lVar9 = 0;
    do {
      pdVar4 = pdVar3 + lVar9;
      dVar2 = pdVar4[1];
      local_88.m_storage.m_data[lVar9] = *pdVar4 * local_58;
      (local_88.m_storage.m_data + lVar9)[1] = dVar2 * local_58;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar7);
  }
  local_98 = (local_98 - local_58) / local_48;
  if ((long)uVar7 < local_88.m_storage.m_rows) {
    do {
      local_88.m_storage.m_data[uVar7] = pdVar3[uVar7] * local_58;
      uVar7 = uVar7 + 1;
    } while (local_88.m_storage.m_rows != uVar7);
  }
  this->Sh = this->Sh * local_98 + local_58;
  pdVar3 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar9 = 0;
    do {
      dVar2 = (pdVar3 + lVar9)[1];
      pdVar3[lVar9] = pdVar3[lVar9] * local_98;
      (pdVar3 + lVar9)[1] = dVar2 * local_98;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar7) {
    do {
      pdVar3[uVar8] = pdVar3[uVar8] * local_98;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  pdVar3 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->Sz).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar9 = 0;
    do {
      dVar5 = (local_78.m_storage.m_data + lVar9)[1];
      dVar2 = (pdVar3 + lVar9)[1];
      pdVar3[lVar9] = local_78.m_storage.m_data[lVar9] + pdVar3[lVar9];
      (pdVar3 + lVar9)[1] = dVar5 + dVar2;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar7) {
    do {
      pdVar3[uVar8] = local_78.m_storage.m_data[uVar8] + pdVar3[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  pdVar3 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar9 = 0;
    do {
      dVar2 = (pdVar3 + lVar9)[1];
      pdVar3[lVar9] = pdVar3[lVar9] * local_98;
      (pdVar3 + lVar9)[1] = dVar2 * local_98;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar7) {
    do {
      pdVar3[uVar8] = pdVar3[uVar8] * local_98;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  pdVar3 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->Sx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar9 = 0;
    do {
      dVar5 = (local_88.m_storage.m_data + lVar9)[1];
      dVar2 = (pdVar3 + lVar9)[1];
      pdVar3[lVar9] = local_88.m_storage.m_data[lVar9] + pdVar3[lVar9];
      (pdVar3 + lVar9)[1] = dVar5 + dVar2;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar7) {
    do {
      pdVar3[uVar8] = local_88.m_storage.m_data[uVar8] + pdVar3[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  pdVar3 = (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  lVar9 = (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->Sxz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  uVar7 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar9) {
    lVar10 = 0;
    do {
      dVar2 = (pdVar3 + lVar10)[1];
      pdVar3[lVar10] = pdVar3[lVar10] * local_98;
      (pdVar3 + lVar10)[1] = dVar2 * local_98;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar7);
  }
  if ((long)uVar7 < lVar9) {
    do {
      pdVar3[uVar7] = pdVar3[uVar7] * local_98;
      uVar7 = uVar7 + 1;
    } while (lVar9 - uVar7 != 0);
  }
  local_40 = &local_88;
  local_38.m_matrix = z;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
            (&this->Sxz,(Matrix<double,__1,_1,_0,__1,_1> *)&local_88,&local_38,&local_99,&local_9a);
  pdVar3 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  lVar9 = (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols * (this->Szz).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
  uVar7 = lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar9) {
    lVar10 = 0;
    do {
      dVar2 = (pdVar3 + lVar10)[1];
      pdVar3[lVar10] = pdVar3[lVar10] * local_98;
      (pdVar3 + lVar10)[1] = dVar2 * local_98;
      lVar10 = lVar10 + 2;
    } while (lVar10 < (long)uVar7);
  }
  if ((long)uVar7 < lVar9) {
    do {
      pdVar3[uVar7] = pdVar3[uVar7] * local_98;
      uVar7 = uVar7 + 1;
    } while (lVar9 - uVar7 != 0);
  }
  local_40 = &local_78;
  local_38.m_matrix = z;
  Eigen::internal::
  outer_product_selector_run<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::DenseShape,Eigen::DenseShape,5>::add>
            (&this->Szz,(Matrix<double,__1,_1,_0,__1,_1> *)&local_78,&local_38,&local_99,&local_9a);
  pdVar3 = (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar9 = 0;
    do {
      dVar2 = (pdVar3 + lVar9)[1];
      pdVar3[lVar9] = pdVar3[lVar9] * local_98;
      (pdVar3 + lVar9)[1] = dVar2 * local_98;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar7) {
    do {
      pdVar3[uVar8] = pdVar3[uVar8] * local_98;
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  pdVar3 = (local_60->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  pdVar4 = (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  uVar7 = (this->Sxx).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  uVar8 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar7) {
    lVar9 = 0;
    do {
      dVar5 = (local_88.m_storage.m_data + lVar9)[1];
      pdVar1 = pdVar3 + lVar9;
      dVar6 = pdVar1[1];
      dVar2 = (pdVar4 + lVar9)[1];
      pdVar4[lVar9] = local_88.m_storage.m_data[lVar9] * *pdVar1 + pdVar4[lVar9];
      (pdVar4 + lVar9)[1] = dVar5 * dVar6 + dVar2;
      lVar9 = lVar9 + 2;
    } while (lVar9 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar7) {
    do {
      pdVar4[uVar8] = local_88.m_storage.m_data[uVar8] * pdVar3[uVar8] + pdVar4[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  this->wPsi = this->wPsi * local_98;
  this->wNu = this->wNu * local_98;
  this->wSigma = this->wSigma * local_98;
  this->wLambda = this->wLambda * local_98;
  free(local_88.m_storage.m_data);
  free(local_78.m_storage.m_data);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::e_step( Z const &z, X const &x, Scal h )
{
    Scal decay = (pow(H+h,alpha) - h) / pow(H,alpha);

    H += h;

    Z zh = z * h;
	X xh = x * h;

	Sh  *= decay; Sh  += h;
	Sz  *= decay; Sz  += zh;
	Sx  *= decay; Sx  += xh;
	Sxz *= decay; Sxz.noalias() += xh * z.transpose();
	Szz *= decay; Szz.noalias() += zh * z.transpose();
	Sxx *= decay; Sxx += xh.cwiseProduct(x);

    wPsi *= decay;
    wNu *= decay;
    wSigma *= decay;
    wLambda *= decay;
}